

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall
JsonParser_serialize_string_Test::~JsonParser_serialize_string_Test
          (JsonParser_serialize_string_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(JsonParser, serialize_string) {
	json_parser parser;

	EXPECT_EQ(parser.serialize<char8_t>(u8"text"), u8R"json("text")json");
	expect_eq(parser.serialize<char8_t>(u8"\"text\""), u8R"json("\"text\"")json");
	expect_eq(parser.serialize<char8_t>(u8"\"te\x01xt\""), u8R"json("\"te\u0001xt\"")json");
	expect_eq(parser.serialize<char8_t>(u8"\"te\x10xt\""), u8R"json("\"te\u0010xt\"")json");

	EXPECT_EQ(parser.serialize<char8_t>(u8"text"), u8R"json("text")json");
	EXPECT_EQ(parser.serialize<char16_t>(u8"text"), uR"json("text")json");
	EXPECT_EQ(parser.serialize<char32_t>(u8"text"), UR"json("text")json");
	EXPECT_EQ(parser.serialize<wchar_t>(u8"text"), LR"json("text")json");
}